

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O0

int nn_ws_match_value(char *termseq,char **subj,int ignore_leading_sp,int ignore_trailing_sp,
                     char **addr,size_t *len)

{
  size_t sVar1;
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  char *in_RDI;
  undefined8 *in_R8;
  long *in_R9;
  bool bVar2;
  char *end;
  char *start;
  char *local_40;
  char *local_38;
  int local_4;
  
  bVar2 = false;
  if (in_RDI != (char *)0x0) {
    bVar2 = *in_RSI != 0;
  }
  if (!bVar2) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","termseq && *subj",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/ws_handshake.c"
            ,0x141);
    fflush(_stderr);
    nn_err_abort();
  }
  local_38 = (char *)*in_RSI;
  if (in_R8 != (undefined8 *)0x0) {
    *in_R8 = 0;
  }
  if (in_R9 != (long *)0x0) {
    *in_R9 = 0;
  }
  local_40 = strstr(local_38,in_RDI);
  if (local_40 == (char *)0x0) {
    local_4 = 0;
  }
  else {
    sVar1 = strlen(in_RDI);
    *in_RSI = (long)(local_40 + sVar1);
    if (in_EDX != 0) {
      for (; *local_38 == ' ' && local_38 < local_40; local_38 = local_38 + 1) {
      }
    }
    if (in_R8 != (undefined8 *)0x0) {
      *in_R8 = local_38;
    }
    if (local_38 == local_40) {
      local_4 = 1;
    }
    else {
      if (in_ECX != 0) {
        for (; local_40[-1] == ' ' && local_38 < local_40; local_40 = local_40 + -1) {
        }
      }
      if (in_R9 != (long *)0x0) {
        *in_R9 = (long)local_40 - (long)local_38;
      }
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int nn_ws_match_value (const char* termseq, const char **subj,
    int ignore_leading_sp, int ignore_trailing_sp, const char **addr,
    size_t* const len)
{
    const char *start;
    const char *end;

    nn_assert (termseq && *subj);

    start = *subj;
    if (addr)
        *addr = NULL;
    if (len)
        *len = 0;

    /*  Find first occurence of termination sequence. */
    end = strstr (start, termseq);

    /*  Was a termination sequence found? */
    if (end) {
        *subj = end + strlen (termseq);
    }
    else {
        return NN_WS_HANDSHAKE_NOMATCH;
    }
        
    if (ignore_leading_sp) {
        while (*start == '\x20' && start < end) {
            start++;
        }
    }

    if (addr)
        *addr = start;

    /*  In this special case, the value was "found", but is just empty or
        ignored space. */
    if (start == end)
        return NN_WS_HANDSHAKE_MATCH;

    if (ignore_trailing_sp) {
        while (*(end - 1) == '\x20' && start < end) {
            end--;
        }
    }

    if (len)
        *len = end - start;

    return NN_WS_HANDSHAKE_MATCH;
}